

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> * __thiscall
kj::_::NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::operator=
          (NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this,
          NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *other)

{
  OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError> *params;
  NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *other_local;
  NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::OneOf<unsigned_long,kj::HttpHeaders::ProtocolError>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::OneOf<unsigned_long,kj::HttpHeaders::ProtocolError>>(&(other->field_1).value);
      ctor<kj::OneOf<unsigned_long,kj::HttpHeaders::ProtocolError>,kj::OneOf<unsigned_long,kj::HttpHeaders::ProtocolError>>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }